

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidRankInconsistency(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *pNVar6;
  ActivationParams *pAVar7;
  Tensor *pTVar8;
  ostream *poVar9;
  Model m;
  Result res;
  
  CoreML::Specification::Model::Model(&m);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"A");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"C");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pNVar5 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  pNVar5->arrayinputshapemapping_ = 1;
  pNVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar5->layers_);
  pAVar7 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar6);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar7);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar6,"relu1");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"B");
  pTVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&pNVar6->outputtensor_);
  pTVar8->rank_ = 1;
  pNVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar5->layers_);
  pAVar7 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar6);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar7);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar6,"relu2");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"C");
  pTVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&pNVar6->inputtensor_);
  pTVar8->rank_ = 2;
  CoreML::validate<(MLModelType)500>(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x12ce);
    poVar9 = std::operator<<(poVar9,": error: ");
    poVar9 = std::operator<<(poVar9,"!((res).good())");
    poVar9 = std::operator<<(poVar9," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return (uint)bVar1;
}

Assistant:

int testInvalidRankInconsistency() {
    /*
     A -> relu1 -> B -> relu2 -> C
     rank of B when output of relu1 : 1
     rank of B when input of relu2: 2 (makes the model invalid)
     */
    
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("C");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    
    auto *l = nn->add_layers();
    (void)l->mutable_activation()->mutable_relu();
    l->set_name("relu1");
    l->add_input("A");
    l->add_output("B");
    l->add_outputtensor()->set_rank(1);
    
    auto *l2 = nn->add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu2");
    l2->add_input("B");
    l2->add_output("C");
    l2->add_inputtensor()->set_rank(2);
    
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}